

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  idx_t iVar4;
  idx_t iVar5;
  long lVar6;
  idx_t iVar7;
  ulong uVar8;
  idx_t iVar9;
  idx_t iVar10;
  ulong uVar11;
  SelectionVector *pSVar12;
  ulong uVar13;
  idx_t iVar14;
  ulong uVar15;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar6 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        lVar6 = 0;
        uVar11 = 0;
        do {
          uVar8 = uVar11;
          if (psVar1 != (sel_t *)0x0) {
            uVar8 = (ulong)psVar1[uVar11];
          }
          uVar13 = uVar11;
          if (psVar2 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar2[uVar11];
          }
          uVar15 = uVar11;
          if (psVar3 != (sel_t *)0x0) {
            uVar15 = (ulong)psVar3[uVar11];
          }
          if ((ldata[uVar13].upper <= rdata[uVar15].upper) &&
             (ldata[uVar13].lower <= rdata[uVar15].lower ||
              ldata[uVar13].upper != rdata[uVar15].upper)) {
            false_sel->sel_vector[lVar6] = (sel_t)uVar8;
            lVar6 = lVar6 + 1;
          }
          uVar11 = uVar11 + 1;
        } while (count != uVar11);
      }
      return count - lVar6;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      iVar5 = 0;
      uVar11 = 0;
      do {
        uVar8 = uVar11;
        if (psVar1 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar1[uVar11];
        }
        uVar13 = uVar11;
        if (psVar2 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar2[uVar11];
        }
        uVar15 = uVar11;
        if (psVar3 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar3[uVar11];
        }
        if ((rdata[uVar15].upper < ldata[uVar13].upper) ||
           (rdata[uVar15].lower < ldata[uVar13].lower && ldata[uVar13].upper == rdata[uVar15].upper)
           ) {
          true_sel->sel_vector[iVar5] = (sel_t)uVar8;
          iVar5 = iVar5 + 1;
        }
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
      return iVar5;
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    iVar7 = 0;
    iVar5 = 0;
    iVar9 = 0;
    do {
      iVar14 = iVar7;
      if (psVar1 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar1[iVar7];
      }
      iVar4 = iVar7;
      if (psVar2 != (sel_t *)0x0) {
        iVar4 = (idx_t)psVar2[iVar7];
      }
      iVar10 = iVar7;
      if (psVar3 != (sel_t *)0x0) {
        iVar10 = (idx_t)psVar3[iVar7];
      }
      if ((rdata[iVar10].upper < ldata[iVar4].upper) ||
         (rdata[iVar10].lower < ldata[iVar4].lower && ldata[iVar4].upper == rdata[iVar10].upper)) {
        iVar4 = iVar5 + 1;
        iVar10 = iVar9;
        pSVar12 = true_sel;
      }
      else {
        iVar4 = iVar5;
        iVar10 = iVar9 + 1;
        iVar5 = iVar9;
        pSVar12 = false_sel;
      }
      pSVar12->sel_vector[iVar5] = (sel_t)iVar14;
      iVar7 = iVar7 + 1;
      iVar5 = iVar4;
      iVar9 = iVar10;
    } while (count != iVar7);
    return iVar4;
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}